

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs2051.cpp
# Opt level: O0

Layout * ear::getLayout(Layout *__return_storage_ptr__,string *name)

{
  bool bVar1;
  unknown_layout *this;
  reference pLVar2;
  __normal_iterator<const_ear::Layout_*,_std::vector<ear::Layout,_std::allocator<ear::Layout>_>_>
  local_48;
  string *local_40;
  Layout *local_38;
  __normal_iterator<const_ear::Layout_*,_std::vector<ear::Layout,_std::allocator<ear::Layout>_>_>
  local_30;
  __normal_iterator<const_ear::Layout_*,_std::vector<ear::Layout,_std::allocator<ear::Layout>_>_>
  local_28;
  __normal_iterator<const_ear::Layout_*,_std::vector<ear::Layout,_std::allocator<ear::Layout>_>_> it
  ;
  vector<ear::Layout,_std::allocator<ear::Layout>_> *layouts;
  string *name_local;
  
  it._M_current = (Layout *)loadLayouts();
  local_30._M_current =
       (Layout *)
       std::vector<ear::Layout,_std::allocator<ear::Layout>_>::begin
                 ((vector<ear::Layout,_std::allocator<ear::Layout>_> *)it._M_current);
  local_38 = (Layout *)std::vector<ear::Layout,_std::allocator<ear::Layout>_>::end(it._M_current);
  local_40 = name;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<ear::Layout_const*,std::vector<ear::Layout,std::allocator<ear::Layout>>>,ear::getLayout(std::__cxx11::string_const&)::__0>
                       (local_30,(__normal_iterator<const_ear::Layout_*,_std::vector<ear::Layout,_std::allocator<ear::Layout>_>_>
                                  )local_38,(anon_class_8_1_898f2789_for__M_pred)name);
  local_48._M_current =
       (Layout *)std::vector<ear::Layout,_std::allocator<ear::Layout>_>::end(it._M_current);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_48);
  if (!bVar1) {
    pLVar2 = __gnu_cxx::
             __normal_iterator<const_ear::Layout_*,_std::vector<ear::Layout,_std::allocator<ear::Layout>_>_>
             ::operator*(&local_28);
    Layout::Layout(__return_storage_ptr__,pLVar2);
    return __return_storage_ptr__;
  }
  this = (unknown_layout *)__cxa_allocate_exception(0x10);
  unknown_layout::unknown_layout(this,name);
  __cxa_throw(this,&unknown_layout::typeinfo,unknown_layout::~unknown_layout);
}

Assistant:

Layout getLayout(const std::string& name) {
    auto& layouts = loadLayouts();
    auto it = std::find_if(
        layouts.begin(), layouts.end(),
        [&name](const Layout& l) -> bool { return l.name() == name; });
    if (it == layouts.end()) {
      throw unknown_layout(name);
    }
    return *it;
  }